

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaPNKalm.cpp
# Opt level: O0

void __thiscall NaPNKalman::allocate_resources(NaPNKalman *this)

{
  NaDataFile *pNVar1;
  long in_RDI;
  NaMatrix *unaff_retaddr;
  uint in_stack_0000000c;
  int in_stack_00000018;
  NaBinaryDataType in_stack_0000001c;
  char *in_stack_00000020;
  long lVar2;
  
  lVar2 = in_RDI;
  NaVector::new_dim((NaVector *)this,in_stack_0000000c);
  NaVector::new_dim((NaVector *)this,in_stack_0000000c);
  NaMatrix::new_dim(unaff_retaddr,(uint)((ulong)lVar2 >> 0x20),(uint)lVar2);
  NaMatrix::new_dim(unaff_retaddr,(uint)((ulong)lVar2 >> 0x20),(uint)lVar2);
  if ((*(byte *)(in_RDI + 0x3a) & 1) == 0) {
    *(undefined8 *)(in_RDI + 0x3d0) = 0;
    *(undefined8 *)(in_RDI + 0x3d8) = 0;
  }
  else {
    pNVar1 = OpenOutputDataFile(in_stack_00000020,in_stack_0000001c,in_stack_00000018);
    *(NaDataFile **)(in_RDI + 0x3d0) = pNVar1;
    pNVar1 = OpenOutputDataFile(in_stack_00000020,in_stack_0000001c,in_stack_00000018);
    *(NaDataFile **)(in_RDI + 0x3d8) = pNVar1;
  }
  return;
}

Assistant:

void
NaPNKalman::allocate_resources ()
{
    // Allocate internal buffers
    x.new_dim(n);
    x_extra.new_dim(n);

    P_tilde.new_dim(n, n);
    P_extra.new_dim(n, n);

    if(bVerbose){
        dfK = OpenOutputDataFile("K.dat");
        dfP_tilde = OpenOutputDataFile("P_tilde.dat");
    }else{
        dfK = NULL;
        dfP_tilde = NULL;
    }
}